

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_tmpfile(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  JSContext *ctx_00;
  int in_ECX;
  JSContext *in_RSI;
  FILE *in_RDI;
  undefined8 in_R8;
  JSValue JVar1;
  FILE *f;
  undefined8 uVar2;
  BOOL in_stack_ffffffffffffffd0;
  undefined1 local_10 [16];
  
  ctx_00 = (JSContext *)tmpfile();
  if (0 < in_ECX) {
    uVar2 = in_R8;
    if (ctx_00 == (JSContext *)0x0) {
      __errno_location();
    }
    obj.tag._0_4_ = in_stack_ffffffffffffffd0;
    obj.u.ptr = (void *)uVar2;
    obj.tag._4_4_ = in_ECX;
    js_set_error_object(ctx_00,obj,(int)((ulong)in_R8 >> 0x20));
  }
  if (ctx_00 == (JSContext *)0x0) {
    local_10._0_8_ = local_10._4_8_ << 0x20;
    local_10._8_8_ = 2;
  }
  else {
    local_10 = (undefined1  [16])js_new_std_file(in_RSI,in_RDI,in_ECX,in_stack_ffffffffffffffd0);
  }
  JVar1.u = (JSValueUnion)local_10._0_8_;
  JVar1.tag = local_10._8_8_;
  return JVar1;
}

Assistant:

static JSValue js_std_tmpfile(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    FILE *f;
    f = tmpfile();
    if (argc >= 1)
        js_set_error_object(ctx, argv[0], f ? 0 : errno);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, FALSE);
}